

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

int Cba_ReadHexDigit(char HexChar)

{
  int iVar1;
  
  if ((byte)(HexChar - 0x30U) < 10) {
    iVar1 = -0x30;
  }
  else if ((byte)(HexChar + 0xbfU) < 6) {
    iVar1 = -0x37;
  }
  else {
    if (5 < (byte)(HexChar + 0x9fU)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaBlast.c"
                    ,0x4a,"int Cba_ReadHexDigit(char)");
    }
    iVar1 = -0x57;
  }
  return HexChar + iVar1;
}

Assistant:

int Cba_ReadHexDigit( char HexChar )
{
    if ( HexChar >= '0' && HexChar <= '9' )
        return HexChar - '0';
    if ( HexChar >= 'A' && HexChar <= 'F' )
        return HexChar - 'A' + 10;
    if ( HexChar >= 'a' && HexChar <= 'f' )
        return HexChar - 'a' + 10;
    assert( 0 ); // not a hexadecimal symbol
    return -1; // return value which makes no sense
}